

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O3

int handle_include_path(dmr_C *C,stream *stream,token **list,token *token,int how)

{
  char *__s;
  token *ptVar1;
  uint uVar2;
  int iVar3;
  token *ptVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  int flen;
  token *token_00;
  char **ppcVar9;
  uint local_38;
  byte local_34;
  
  ptVar4 = token->next;
  if ((((ulong)ptVar4->pos & 0x3f) != 0x11) || ((ptVar4->field_2).special != 0x3c)) {
    expand_list(C,&token->next);
    ptVar4 = token->next;
    local_38 = 0;
    local_34 = 1;
    if ((((ulong)ptVar4->pos & 0x3f) != 0x11) || ((ptVar4->field_2).special != 0x3c))
    goto LAB_00120598;
  }
  local_38 = 0x3e;
  local_34 = 0;
  token = ptVar4;
LAB_00120598:
  ptVar4 = token->next;
  __s = C->preprocessor_tokenseqbuffer;
  token_00 = &dmrC_eof_token_entry_;
  ptVar1 = ptVar4;
  pcVar8 = __s;
  if (ptVar4 != &dmrC_eof_token_entry_) {
    do {
      token_00 = ptVar1;
      uVar2 = SUB84(token_00->pos,0) & 0x3f;
      if (uVar2 == 0x11) {
        if ((token_00->field_2).special == local_38) goto LAB_00120634;
LAB_001205ed:
        pcVar6 = dmrC_show_token(C,token_00);
      }
      else {
        if (uVar2 != 0xf) goto LAB_001205ed;
        pcVar6 = (char *)((long)&((token_00->field_2).ident)->next + 4);
      }
      sVar5 = strlen(pcVar6);
      memcpy(pcVar8,pcVar6,(long)(int)sVar5);
      pcVar8 = pcVar8 + (int)sVar5;
      ptVar1 = token_00->next;
    } while (token_00->next != &dmrC_eof_token_entry_);
    token_00 = &dmrC_eof_token_entry_;
  }
LAB_00120634:
  *pcVar8 = '\0';
  if ((local_34 == 0) &&
     ((((ulong)token_00->pos & 0x3f) != 0x11 || ((token_00->field_2).special != local_38)))) {
    dmrC_sparse_error(C,ptVar4->pos,"expected \'>\' at end of filename");
  }
  sVar5 = strlen(__s);
  flen = (int)sVar5 + 1;
  if (*__s == '/') {
    iVar3 = try_include(C,"",__s,flen,list,C->includepath);
    if (iVar3 == 0) {
LAB_001206ac:
      dmrC_error_die(C,ptVar4->pos,"unable to open \'%s\'",__s);
    }
  }
  else {
    if (how == 2) {
      ppcVar9 = C->includepath;
      C->includepath[0] = "";
    }
    else if (how == 1) {
      ppcVar9 = stream->next_path;
    }
    else {
      pcVar8 = stream->path;
      if (pcVar8 == (char *)0x0) {
        pcVar8 = stream->name;
        pcVar6 = strrchr(pcVar8,0x2f);
        if (pcVar6 == (char *)0x0) {
          pcVar8 = "";
        }
        else {
          lVar7 = (ulong)(uint)((int)pcVar6 - (int)pcVar8) << 0x20;
          pcVar8 = (char *)dmrC_allocator_allocate(&C->byte_allocator,lVar7 + 0x200000000 >> 0x20);
          sVar5 = lVar7 + 0x100000000 >> 0x20;
          memcpy(pcVar8,stream->name,sVar5);
          pcVar8[sVar5] = '\0';
        }
        stream->path = pcVar8;
      }
      C->includepath[0] = pcVar8;
      ppcVar9 = *(char ***)(C->date_buffer + (ulong)(local_34 ^ 1) * 8 + -0x28);
    }
    do {
      if (*ppcVar9 == (char *)0x0) goto LAB_001206ac;
      iVar3 = try_include(C,*ppcVar9,__s,flen,list,ppcVar9 + 1);
      ppcVar9 = ppcVar9 + 1;
    } while (iVar3 == 0);
  }
  return iVar3;
}

Assistant:

static int handle_include_path(struct dmr_C *C, struct stream *stream, struct token **list, struct token *token, int how)
{
	const char *filename;
	struct token *next;
	const char **path;
	int expect;
	int flen;

	next = token->next;
	expect = '>';
	if (!dmrC_match_op(next, '<')) {
		expand_list(C, &token->next);
		expect = 0;
		next = token;
		if (dmrC_match_op(token->next, '<')) {
			next = token->next;
			expect = '>';
		}
	}

	token = next->next;
	filename = token_name_sequence(C, token, expect, token);
	flen = (int)strlen(filename) + 1;

	/* Absolute path? */
	if (filename[0] == '/') {
		if (try_include(C, "", filename, flen, list, C->includepath))
			return 0;
		goto out;
	}

	switch (how) {
	case 1:
		path = stream->next_path;
		break;
	case 2:
		C->includepath[0] = "";
		path = C->includepath;
		break;
	default:
		/* Dir of input file is first dir to search for quoted includes */
		set_stream_include_path(C, stream);
		path = expect ? C->angle_includepath : C->quote_includepath;
		break;
	}
	/* Check the standard include paths.. */
	if (do_include_path(C, path, list, token, filename, flen))
		return 0;
out:
	dmrC_error_die(C, token->pos, "unable to open '%s'", filename);
	return 0;
}